

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::take_while<rangeless::fn::impl::call_count_lt>::operator()
          (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,take_while<rangeless::fn::impl::call_count_lt> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont)

{
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_60;
  const_iterator local_58;
  const_iterator local_50;
  size_t local_48;
  size_t local_40;
  X *local_38;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_30;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  local_28;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  it;
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont_local;
  take_while<rangeless::fn::impl::call_count_lt> *this_local;
  
  it._M_current = (X *)cont;
  local_30._M_current =
       (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::begin
                      (cont);
  local_38 = (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end
                            (cont);
  local_48 = (this->pred).cap;
  local_40 = (this->pred).num_calls;
  local_28 = std::
             find_if_not<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>,rangeless::fn::impl::call_count_lt>
                       (local_30,(__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                                  )local_38,this->pred);
  __gnu_cxx::
  __normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
  ::__normal_iterator<rangeless::fn::impl::X*>
            ((__normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
              *)&local_50,&local_28);
  local_60._M_current =
       (X *)std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::end(cont);
  __gnu_cxx::
  __normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
  ::__normal_iterator<rangeless::fn::impl::X*>
            ((__normal_iterator<rangeless::fn::impl::X_const*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
              *)&local_58,&local_60);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::erase
            (cont,local_50,local_58);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::vector
            (__return_storage_ptr__,cont);
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Container cont) const
        {
            auto it = std::find_if_not(cont.begin(), cont.end(), pred);
            cont.erase(it, cont.end()); 
            return cont;
        }